

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_map_find(wally_map *map_in,uchar *key,size_t key_len,size_t *written)

{
  int iVar1;
  wally_map_item *item;
  size_t i;
  size_t *written_local;
  size_t key_len_local;
  uchar *key_local;
  wally_map *map_in_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((map_in == (wally_map *)0x0) || (key == (uchar *)0x0)) ||
      ((key != (uchar *)0x0) != (key_len != 0))) || (written == (size_t *)0x0)) {
    map_in_local._4_4_ = -2;
  }
  else {
    for (item = (wally_map_item *)0x0; item < (wally_map_item *)map_in->num_items;
        item = (wally_map_item *)((long)&item->key + 1)) {
      if (key_len == map_in->items[(long)item].key_len) {
        iVar1 = memcmp(key,map_in->items[(long)item].key,key_len);
        if (iVar1 == 0) {
          *written = (size_t)((long)&item->key + 1);
          break;
        }
      }
    }
    map_in_local._4_4_ = 0;
  }
  return map_in_local._4_4_;
}

Assistant:

int wally_map_find(const struct wally_map *map_in,
                   const unsigned char *key, size_t key_len,
                   size_t *written)
{
    size_t i;

    if (written)
        *written = 0;

    if (!map_in || !key || BYTES_INVALID(key, key_len) || !written)
        return WALLY_EINVAL;

    for (i = 0; i < map_in->num_items; ++i) {
        const struct wally_map_item *item = &map_in->items[i];

        if (key_len == item->key_len && memcmp(key, item->key, key_len) == 0) {
            *written = i + 1; /* Found */
            break;
        }
    }
    return WALLY_OK;
}